

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseFactor(Parser *this)

{
  function<bool_(const_Token_&)> *in_RSI;
  tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_> in_RDI;
  function<bool_(const_Token_&)> *in_stack_00000028;
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()>
  *in_stack_00000030;
  Parser *in_stack_00000038;
  anon_class_1_0_00000001 predicate;
  __uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_> __f;
  Parser *local_50 [10];
  
  __f._M_t.super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
  super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl =
       (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)
       (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)
       in_RDI.super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
       super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  std::
  bind<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),Parser*>
            ((offset_in_Parser_to_subr *)
             in_RDI.super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
             super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl,local_50);
  std::function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>()>::
  function<std::_Bind<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*(Parser*))()>,void>
            ((function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *)
             in_RSI,(_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>
                     *)__f._M_t.
                       super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>
                       .super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl);
  std::function<bool(Token_const&)>::function<Parser::parseFactor()::__0_const&,void>
            (in_RSI,(anon_class_1_0_00000001 *)
                    __f._M_t.
                    super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
                    super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl);
  parseExpression(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::function<bool_(const_Token_&)>::~function((function<bool_(const_Token_&)> *)0x19c8d6);
  std::function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()>::~function
            ((function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *)
             0x19c8e3);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
         super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseFactor()
{
  const auto predicate = [](const Token& token) 
  { 
    return token.type == TokenType::Mul ||
      token.type == TokenType::Div; 
  };
  return parseExpression(std::bind(&Parser::parseUnary, this), predicate);
}